

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.cpp
# Opt level: O3

bool readFileIntoBuffer(CBString *inPath,UByteArray *buf)

{
  int iVar1;
  bool bVar2;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  vector<char,_std::allocator<char>_> buffer;
  ifstream inputFile;
  void *local_258;
  undefined8 local_250;
  undefined1 *local_240 [2];
  undefined1 local_230 [16];
  stat local_220;
  undefined8 auStack_138 [36];
  
  iVar1 = stat((char *)(inPath->super_tagbstring).data,&local_220);
  if (iVar1 == 0) {
    std::ifstream::ifstream(&local_220,(char *)(inPath->super_tagbstring).data,_S_in|_S_bin);
    bVar2 = (*(byte *)((long)local_220.__unused + *(long *)(local_220.st_dev - 0x18) + -0x58) & 5)
            == 0;
    if (bVar2) {
      __first._8_8_ = 0xffffffff;
      __first._M_sbuf = *(streambuf_type **)((long)auStack_138 + *(long *)(local_220.st_dev - 0x18))
      ;
      std::vector<char,std::allocator<char>>::
      vector<std::istreambuf_iterator<char,std::char_traits<char>>,void>
                ((vector<char,std::allocator<char>> *)&local_258,__first,
                 (istreambuf_iterator<char,_std::char_traits<char>_>)(ZEXT816(0xffffffff) << 0x40),
                 (allocator_type *)local_240);
      std::ifstream::close();
      local_240[0] = local_230;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_240,local_258,local_250);
      std::__cxx11::string::_M_assign((string *)buf);
      if (local_240[0] != local_230) {
        operator_delete(local_240[0]);
      }
      if (local_258 != (void *)0x0) {
        operator_delete(local_258);
      }
    }
    std::ifstream::~ifstream(&local_220);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool readFileIntoBuffer(const UString& inPath, UByteArray& buf) 
{
    if (!isExistOnFs(inPath))
        return false;

    std::ifstream inputFile(inPath.toLocal8Bit(), std::ios::in | std::ios::binary);
    if (!inputFile)
        return false;
    std::vector<char> buffer(std::istreambuf_iterator<char>(inputFile),
        (std::istreambuf_iterator<char>()));
    inputFile.close();

    buf = buffer;

    return true;
}